

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_in.c
# Opt level: O2

int GetCode(gdIOCtx *fd,CODE_STATIC_DATA *scd,int code_size,int flag,int *ZeroDataBlockP)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  if (flag == 0) {
    iVar4 = scd->curbit;
    iVar1 = iVar4 + code_size;
    if (scd->lastbit <= iVar1) {
      if (scd->done != 0) {
        return -1;
      }
      scd->buf[0] = scd->buf[(long)scd->last_byte + -2];
      scd->buf[1] = scd->buf[(long)scd->last_byte + -1];
      iVar1 = GetDataBlock(fd,scd->buf + 2,ZeroDataBlockP);
      if (iVar1 < 1) {
        scd->done = 1;
      }
      scd->last_byte = iVar1 + 2;
      iVar2 = scd->curbit - scd->lastbit;
      iVar4 = iVar2 + 0x10;
      scd->curbit = iVar4;
      scd->lastbit = iVar1 * 8 + 0x10;
      iVar1 = iVar2 + code_size + 0x10;
    }
    if (iVar1 < 0x8c1) {
      iVar2 = 0;
      if (code_size < 1) {
        code_size = iVar2;
      }
      uVar3 = 0;
      for (; code_size != iVar2; iVar2 = iVar2 + 1) {
        uVar3 = uVar3 | (uint)((scd->buf[(iVar4 + iVar2) / 8] >> (iVar4 + iVar2 & 7U) & 1) != 0) <<
                        ((byte)iVar2 & 0x1f);
      }
    }
    else {
      uVar3 = 0xffffffff;
    }
    scd->curbit = iVar1;
  }
  else {
    scd->curbit = 0;
    scd->lastbit = 0;
    scd->done = 0;
    scd->last_byte = 2;
    uVar3 = 0;
  }
  return uVar3;
}

Assistant:

static int
GetCode(gdIOCtx *fd, CODE_STATIC_DATA *scd, int code_size, int flag, int *ZeroDataBlockP)
{
	int rv;

	rv = GetCode_(fd, scd, code_size,flag, ZeroDataBlockP);

	if(VERBOSE) {
		printf("[GetCode(,%d,%d) returning %d]\n",code_size,flag,rv);
	}

	return rv;
}